

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O1

EStatusCode __thiscall
OpenTypePrimitiveReader::Read
          (OpenTypePrimitiveReader *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->mInternalState != eFailure) {
    iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])();
    if (CONCAT44(extraout_var,iVar1) != inBufferSize) {
      this->mInternalState = eFailure;
    }
    return -(uint)(CONCAT44(extraout_var,iVar1) != inBufferSize);
  }
  return eFailure;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::Read(Byte* inBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mOpenTypeFile->Read(inBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}